

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_tree_init_pool
               (mpack_tree_t *tree,char *data,size_t length,mpack_node_data_t *node_pool,
               size_t node_pool_count)

{
  size_t node_pool_count_local;
  mpack_node_data_t *node_pool_local;
  size_t length_local;
  char *data_local;
  mpack_tree_t *tree_local;
  
  mpack_tree_init_clear(tree);
  tree->next = (mpack_tree_page_t *)0x0;
  if (node_pool_count == 0) {
    mpack_tree_flag_error(tree,mpack_error_bug);
  }
  else {
    tree->data = data;
    tree->data_length = length;
    tree->pool = node_pool;
    tree->pool_count = node_pool_count;
  }
  return;
}

Assistant:

void mpack_tree_init_pool(mpack_tree_t* tree, const char* data, size_t length,
        mpack_node_data_t* node_pool, size_t node_pool_count)
{
    mpack_tree_init_clear(tree);
    #ifdef MPACK_MALLOC
    tree->next = NULL;
    #endif

    if (node_pool_count == 0) {
        mpack_break("initial page has no nodes!");
        mpack_tree_flag_error(tree, mpack_error_bug);
        return;
    }

    tree->data = data;
    tree->data_length = length;
    tree->pool = node_pool;
    tree->pool_count = node_pool_count;

    mpack_log("===========================\n");
    mpack_log("initializing tree with data of size %i and pool of count %i\n",
            (int)length, (int)node_pool_count);
}